

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O3

void __thiscall
Master::freeROMImages(Master *this,ROMImage **controlROMImage,ROMImage **pcmROMImage)

{
  QArrayData *pQVar1;
  SynthRoute **ppSVar2;
  long lVar3;
  bool bVar4;
  File *pFVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  ROMImage *synthPCMROMImage;
  ROMImage *synthControlROMImage;
  ROMImage *local_40;
  ROMImage *local_38;
  
  if (*pcmROMImage != (ROMImage *)0x0 || *controlROMImage != (ROMImage *)0x0) {
    bVar8 = false;
    local_38 = (ROMImage *)0x0;
    local_40 = (ROMImage *)0x0;
    if (this->audioFileWriterSynth == (QSynth *)0x0) {
      bVar7 = false;
    }
    else {
      QSynth::getROMImages(this->audioFileWriterSynth,&local_38,&local_40);
      bVar7 = local_38 == *controlROMImage;
      bVar8 = local_40 == *pcmROMImage;
      if (bVar7 && bVar8) {
        return;
      }
    }
    pQVar1 = &((this->synthRoutes).d.d)->super_QArrayData;
    ppSVar2 = (this->synthRoutes).d.ptr;
    lVar3 = (this->synthRoutes).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar3 == 0) {
      bVar4 = true;
    }
    else {
      lVar6 = 0;
      do {
        SynthRoute::getROMImages(*(SynthRoute **)((long)ppSVar2 + lVar6),&local_38,&local_40);
        bVar7 = (bool)(bVar7 | local_38 == *controlROMImage);
        bVar8 = (bool)(bVar8 | local_40 == *pcmROMImage);
        bVar4 = (bool)(bVar7 & bVar8);
        if (bVar4) {
          bVar7 = true;
          bVar8 = true;
          break;
        }
        lVar6 = lVar6 + 8;
      } while (lVar3 << 3 != lVar6);
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,8);
      }
    }
    if (bVar4) {
      if ((!bVar7) && (*controlROMImage != (ROMImage *)0x0)) {
        bVar7 = MT32Emu::ROMImage::isFileUserProvided(*controlROMImage);
        if ((bVar7) &&
           (pFVar5 = MT32Emu::ROMImage::getFile(*controlROMImage), pFVar5 != (File *)0x0)) {
          (*pFVar5->_vptr_File[1])(pFVar5);
        }
        MT32Emu::ROMImage::freeROMImage(*controlROMImage);
        *controlROMImage = (ROMImage *)0x0;
      }
      if ((!bVar8) && (*pcmROMImage != (ROMImage *)0x0)) {
        bVar8 = MT32Emu::ROMImage::isFileUserProvided(*pcmROMImage);
        if ((bVar8) && (pFVar5 = MT32Emu::ROMImage::getFile(*pcmROMImage), pFVar5 != (File *)0x0)) {
          (*pFVar5->_vptr_File[1])(pFVar5);
        }
        MT32Emu::ROMImage::freeROMImage(*pcmROMImage);
        *pcmROMImage = (ROMImage *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Master::freeROMImages(const MT32Emu::ROMImage *&controlROMImage, const MT32Emu::ROMImage *&pcmROMImage) const {
	if (controlROMImage == NULL && pcmROMImage == NULL) return;
	bool controlROMInUse = false;
	bool pcmROMInUse = false;
	const MT32Emu::ROMImage *synthControlROMImage = NULL;
	const MT32Emu::ROMImage *synthPCMROMImage = NULL;
	if (audioFileWriterSynth != NULL) {
		audioFileWriterSynth->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = synthControlROMImage == controlROMImage;
		pcmROMInUse = synthPCMROMImage == pcmROMImage;
		if (controlROMInUse && pcmROMInUse) return;
	}
	foreach (SynthRoute *synthRoute, synthRoutes) {
		synthRoute->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = controlROMInUse || (synthControlROMImage == controlROMImage);
		pcmROMInUse = pcmROMInUse || (synthPCMROMImage == pcmROMImage);
		if (controlROMInUse && pcmROMInUse) return;
	}
	if (!controlROMInUse && controlROMImage != NULL) {
		if (controlROMImage->isFileUserProvided()) delete controlROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(controlROMImage);
		controlROMImage = NULL;
	}
	if (!pcmROMInUse && pcmROMImage != NULL) {
		if (pcmROMImage->isFileUserProvided()) delete pcmROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(pcmROMImage);
		pcmROMImage = NULL;
	}
}